

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::~Application(Application *this)

{
  PathTracer *this_00;
  Scene *this_01;
  pointer piVar1;
  
  (this->super_Renderer)._vptr_Renderer = (_func_int **)&PTR__Application_00277210;
  this_00 = this->pathtracer;
  if (this_00 != (PathTracer *)0x0) {
    PathTracer::~PathTracer(this_00);
    operator_delete(this_00);
  }
  this_01 = this->scene;
  if (this_01 != (Scene *)0x0) {
    DynamicScene::Scene::~Scene(this_01);
    operator_delete(this_01);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->timeline).times._M_t);
  piVar1 = (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  OSDText::~OSDText(&this->textManager);
  std::
  _Rb_tree<CMU462::DynamicScene::Joint_*,_std::pair<CMU462::DynamicScene::Joint_*const,_CMU462::Vector3D>,_std::_Select1st<std::pair<CMU462::DynamicScene::Joint_*const,_CMU462::Vector3D>_>,_std::less<CMU462::DynamicScene::Joint_*>,_std::allocator<std::pair<CMU462::DynamicScene::Joint_*const,_CMU462::Vector3D>_>_>
  ::~_Rb_tree(&(this->ikTargets)._M_t);
  return;
}

Assistant:

Application::~Application() {
  if (pathtracer != nullptr) delete pathtracer;
  if (scene != nullptr) delete scene;
}